

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

unique_ptr<Lexer,_std::default_delete<Lexer>_>
createLexer(CommandLineParseResult *parseResult,Option *eval,Option *file)

{
  _Alloc_hider _Var1;
  bool bVar2;
  runtime_error *this;
  Option *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  ifstream stream;
  int aiStack_208 [122];
  
  bVar2 = CommandLineParseResult::hasOption((CommandLineParseResult *)eval,file);
  if (bVar2) {
    CommandLineParseResult::getValue_abi_cxx11_
              ((string *)&stream,(CommandLineParseResult *)eval,file);
    std::make_unique<TextLexer,std::__cxx11::string>(&local_248);
    _Var1._M_p = local_248._M_dataplus._M_p;
    local_248._M_dataplus._M_p = (pointer)0x0;
    (parseResult->flags)._M_h._M_buckets = (__buckets_ptr)_Var1._M_p;
    std::unique_ptr<TextLexer,_std::default_delete<TextLexer>_>::~unique_ptr
              ((unique_ptr<TextLexer,_std::default_delete<TextLexer>_> *)&local_248);
    std::__cxx11::string::~string((string *)&stream);
  }
  else {
    CommandLineParseResult::getValue_abi_cxx11_(&local_248,(CommandLineParseResult *)eval,in_RCX);
    std::ifstream::ifstream(&stream,(string *)&local_248,_S_in);
    std::__cxx11::string::~string((string *)&local_248);
    if (*(int *)((long)aiStack_208 + *(long *)(_stream + -0x18)) != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Invalid path");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::make_unique<FileLexer,std::ifstream>
              ((basic_ifstream<char,_std::char_traits<char>_> *)&local_248);
    _Var1._M_p = local_248._M_dataplus._M_p;
    local_248._M_dataplus._M_p = (pointer)0x0;
    (parseResult->flags)._M_h._M_buckets = (__buckets_ptr)_Var1._M_p;
    std::unique_ptr<FileLexer,_std::default_delete<FileLexer>_>::~unique_ptr
              ((unique_ptr<FileLexer,_std::default_delete<FileLexer>_> *)&local_248);
    std::ifstream::~ifstream(&stream);
  }
  return (__uniq_ptr_data<Lexer,_std::default_delete<Lexer>,_true,_true>)
         (__uniq_ptr_data<Lexer,_std::default_delete<Lexer>,_true,_true>)parseResult;
}

Assistant:

auto createLexer(CommandLineParseResult parseResult, Option* eval, Option* file) -> std::unique_ptr<Lexer> {
    if (parseResult.hasOption(*eval)) {
        return std::make_unique<TextLexer>(parseResult.getValue(*eval));
    } else {
        auto stream = std::ifstream(parseResult.getValue(*file), std::ios::in);
        if (!stream.good())
            throw std::runtime_error("Invalid path");

        return std::make_unique<FileLexer>(std::move(stream));
    }
}